

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall problem_parser::problem_parser(problem_parser *this)

{
  undefined1 auVar1 [16];
  __shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  (this->m_problem).type = maximize;
  (this->m_problem).status = success;
  (this->m_problem).less_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).less_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_problem).vars.names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).vars.names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).vars.names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_problem).vars.values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).vars.values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).vars.values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_problem).objective.value = 0.0;
  (this->m_problem).equal_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).equal_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).equal_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_problem).greater_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).greater_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).greater_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_problem).less_constraints.
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_problem).strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_problem).objective.elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).objective.elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).objective.elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_problem).objective.qelements.
  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_problem).objective.qelements.
  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_problem).objective.qelements.
  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1 = ZEXT416(0) << 0x40;
  (this->m_cache_variable)._M_h._M_buckets = &(this->m_cache_variable)._M_h._M_single_bucket;
  (this->m_cache_variable)._M_h._M_bucket_count = 1;
  (this->m_cache_variable)._M_h._M_before_begin = (__node_base)auVar1._0_8_;
  (this->m_cache_variable)._M_h._M_element_count = auVar1._8_8_;
  (this->m_cache_variable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->m_cache_variable)._M_h._M_rehash_policy._M_next_resize = auVar1;
  std::make_shared<baryonyx::string_buffer>();
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

problem_parser()
    {
        m_problem.strings = std::make_shared<baryonyx::string_buffer>();
    }